

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::SysStatsConfig::SysStatsConfig(SysStatsConfig *this,SysStatsConfig *param_1)

{
  pointer pMVar1;
  pointer pVVar2;
  pointer pSVar3;
  uint32_t uVar4;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__SysStatsConfig_00407808;
  this->meminfo_period_ms_ = param_1->meminfo_period_ms_;
  pMVar1 = (param_1->meminfo_counters_).
           super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->meminfo_counters_).
       super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar1;
  (this->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->meminfo_counters_).
       super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->vmstat_period_ms_ = param_1->vmstat_period_ms_;
  pVVar2 = (param_1->vmstat_counters_).
           super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->vmstat_counters_).
       super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  (this->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->vmstat_counters_).
       super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->stat_period_ms_ = param_1->stat_period_ms_;
  pSVar3 = (param_1->stat_counters_).
           super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->stat_counters_).
       super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
  (this->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->stat_counters_).
       super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = param_1->cpufreq_period_ms_;
  this->devfreq_period_ms_ = param_1->devfreq_period_ms_;
  this->cpufreq_period_ms_ = uVar4;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

SysStatsConfig::SysStatsConfig(SysStatsConfig&&) noexcept = default;